

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::ComputeLinkImplementationLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkImplementation *impl,
          cmGeneratorTarget *head,LinkInterfaceFor implFor)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  cmGeneratorTarget *pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer ppVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar6;
  _Base_ptr n;
  cmGlobalGenerator *config_00;
  _Alloc_hider _Var7;
  size_type sVar8;
  pointer pbVar9;
  undefined8 uVar10;
  bool bVar11;
  PolicyStatus PVar12;
  int iVar13;
  int iVar14;
  string *psVar15;
  cmTarget *this_01;
  ostream *poVar16;
  cmSourceFile *this_02;
  cmake *pcVar17;
  cmValue cVar18;
  _Rb_tree_node_base *p_Var19;
  iterator iVar20;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var21;
  LinkLibraryVectorType *pLVar22;
  PolicyID id;
  long lVar23;
  pointer item_00;
  cmLinkImplItem *pcVar24;
  uint uVar25;
  pointer pcVar26;
  cmLinkImplItem *this_03;
  iterator __first;
  cmLinkImplItem *item_1;
  cmGeneratorTarget *pcVar27;
  long lVar28;
  cmLinkImplItem *pcVar29;
  cmBTStringRange cVar30;
  string_view arg;
  bool checkCMP0027;
  string name_1;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  cmLocalGenerator *lg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  llibs;
  cmGeneratorExpression ge;
  cmGeneratorExpressionDAGChecker dagChecker;
  cmLinkItem item;
  bool local_3d1;
  cmGlobalGenerator *local_3d0;
  cmLinkImplItem *local_3c8;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_3c0;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_3b8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_3b0;
  cmGeneratorExpression local_380;
  undefined4 local_370;
  MessageType local_36c;
  string local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_348;
  size_t local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  cmGeneratorTarget *local_328;
  cmGeneratorTarget *local_320;
  undefined1 local_318 [24];
  cmGlobalGenerator *pcStack_300;
  _Alloc_hider local_2f8;
  cmLocalGenerator *local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  string local_2d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  undefined8 *local_298 [2];
  undefined8 local_288 [2];
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *local_278;
  cmMakefile *local_270;
  _Base_ptr local_268;
  _Base_ptr local_260;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_258;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_250;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [80];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c8;
  bool local_1bc;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined1 local_188 [16];
  element_type *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  _Base_ptr local_168;
  _Base_ptr local_160;
  undefined1 local_158 [32];
  _Base_ptr local_138;
  undefined1 local_130 [16];
  _Base_ptr local_120;
  __node_base local_118;
  _Base_ptr p_Stack_110;
  float local_108;
  _Base_ptr local_100;
  __node_base_ptr ap_Stack_f8 [25];
  
  local_2f0 = this->LocalGenerator;
  local_270 = local_2f0->Makefile;
  local_3b8 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)impl;
  local_380.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = implFor;
  local_2f8._M_p = (pointer)head;
  cVar30 = cmTarget::GetLinkImplementationEntries_abi_cxx11_(this->Target);
  if (cVar30.Begin._M_current._M_current != cVar30.End._M_current._M_current) {
    local_3c8 = (cmLinkImplItem *)&this->PolicyMap;
    local_260 = (_Base_ptr)&this->LinkerLanguage;
    local_278 = (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)
                ((long)&(local_3b8->Value).field_2 + 8);
    local_250 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)&this->LinkImplicitNullProperties;
    local_268 = (_Base_ptr)&this->MaxLanguageStandards;
    local_3d0 = (cmGlobalGenerator *)config;
    do {
      config_00 = local_3d0;
      local_258 = cVar30.End._M_current;
      local_3c0 = cVar30.Begin._M_current;
      local_2b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2d8.field_2._8_6_ = 0x534549524152;
      local_2d8.field_2._M_allocated_capacity._0_6_ = 0x4c5f4b4e494c;
      local_2d8.field_2._M_allocated_capacity._6_2_ = 0x4249;
      local_2d8._M_string_length = 0xe;
      local_2d8.field_2._M_local_buf[0xe] = '\0';
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                ((cmGeneratorExpressionDAGChecker *)local_238,this,&local_2d8,
                 (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,
                        CONCAT26(local_2d8.field_2._M_allocated_capacity._6_2_,
                                 local_2d8.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if ((local_380.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi._4_4_ == Usage) &&
         (PVar12 = cmPolicies::PolicyMap::Get((PolicyMap *)local_3c8,CMP0131), PVar12 - NEW < 3)) {
        local_1bc = true;
      }
      local_2e8._M_allocated_capacity =
           (size_type)
           ((local_3c0._M_current)->Backtrace).
           super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_2e8._8_8_ =
           ((local_3c0._M_current)->Backtrace).
           super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8._8_8_)->_M_use_count + 1;
        }
      }
      cmGeneratorExpression::cmGeneratorExpression
                ((cmGeneratorExpression *)local_248,(cmListFileBacktrace *)&local_2e8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8._8_8_);
      }
      local_298[0] = local_288;
      pcVar26 = ((local_3c0._M_current)->Value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_298,pcVar26,
                 pcVar26 + ((local_3c0._M_current)->Value)._M_string_length);
      cmGeneratorExpression::Parse(&local_380,(string *)local_248);
      if (local_298[0] != local_288) {
        operator_delete(local_298[0],local_288[0] + 1);
      }
      *(bool *)((long)local_380.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                      .TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 0x49) = true;
      psVar15 = cmCompiledGeneratorExpression::Evaluate
                          ((cmCompiledGeneratorExpression *)
                           local_380.Backtrace.
                           super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,this->LocalGenerator,(string *)config_00,
                           (cmGeneratorTarget *)local_2f8._M_p,
                           (cmGeneratorExpressionDAGChecker *)local_238,(cmGeneratorTarget *)0x0,
                           (string *)local_260);
      __n = psVar15->_M_string_length;
      if (__n == ((local_3c0._M_current)->Value)._M_string_length) {
        pcVar26 = (psVar15->_M_dataplus)._M_p;
        if (__n == 0) {
          local_3d1 = false;
        }
        else {
          iVar13 = bcmp(pcVar26,((local_3c0._M_current)->Value)._M_dataplus._M_p,__n);
          local_3d1 = iVar13 != 0;
        }
      }
      else {
        pcVar26 = (psVar15->_M_dataplus)._M_p;
        local_3d1 = true;
      }
      arg._M_str = pcVar26;
      arg._M_len = __n;
      cmExpandList(arg,&local_2b8,false);
      pbVar9 = local_2b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (*(bool *)((long)local_380.Backtrace.
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 0x131) == true) {
        local_3b8[3].Value.field_2._M_local_buf[3] = '\x01';
      }
      if (*(bool *)((long)local_380.Backtrace.
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 0x130) == true) {
        local_3b8[1].Value.field_2._M_local_buf[8] = '\x01';
      }
      n = (_Base_ptr)
          local_2b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
      if (*(bool *)((long)local_380.Backtrace.
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 0x132) == true) {
        local_3b8[3].Value.field_2._M_local_buf[0] = '\x01';
      }
      for (; n != (_Base_ptr)pbVar9; n = n + 1) {
        bVar11 = IsLinkLookupScope(this,(string *)n,&local_2f0);
        if (!bVar11) {
          CheckCMP0004(&local_368,this,(string *)n);
          PVar12 = cmPolicies::PolicyMap::Get((PolicyMap *)local_3c8,CMP0108);
          if ((PVar12 == NEW) &&
             (this_01 = cmMakefile::FindTargetToUse(this->Makefile,&local_368,false),
             this_01 != (cmTarget *)0x0)) {
            cmTarget::GetName_abi_cxx11_(this_01);
            std::__cxx11::string::_M_assign((string *)&local_368);
          }
          psVar15 = cmTarget::GetName_abi_cxx11_(this->Target);
          sVar8 = local_368._M_string_length;
          _Var7._M_p = local_368._M_dataplus._M_p;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_368._M_string_length ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              psVar15->_M_string_length) {
            if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_368._M_string_length !=
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
               (iVar13 = bcmp(local_368._M_dataplus._M_p,(psVar15->_M_dataplus)._M_p,
                              local_368._M_string_length), iVar13 != 0)) goto LAB_003f6159;
LAB_003f61b5:
            psVar15 = cmTarget::GetName_abi_cxx11_(this->Target);
            iVar13 = 6;
            if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_368._M_string_length ==
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 psVar15->_M_string_length) &&
               (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_368._M_string_length ==
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0 ||
                (iVar14 = bcmp(local_368._M_dataplus._M_p,(psVar15->_M_dataplus)._M_p,
                               local_368._M_string_length), iVar14 == 0)))) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              PVar12 = cmPolicies::PolicyMap::Get((PolicyMap *)local_3c8,CMP0038);
              if (PVar12 != OLD) {
                if (PVar12 == WARN) {
                  cmPolicies::GetPolicyWarning_abi_cxx11_(&local_3b0.Value,(cmPolicies *)0x26,id);
                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1a8,local_3b0.Value._M_dataplus._M_p,
                                       local_3b0.Value._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3b0.Value._M_dataplus._M_p != &local_3b0.Value.field_2) {
                    operator_delete(local_3b0.Value._M_dataplus._M_p,
                                    CONCAT17(local_3b0.Value.field_2._M_local_buf[7],
                                             local_3b0.Value.field_2._M_allocated_capacity._0_7_) +
                                    1);
                  }
                  local_370 = 0;
                  local_36c = AUTHOR_WARNING;
                }
                else {
                  local_36c = FATAL_ERROR;
                  local_370 = (undefined4)CONCAT71((uint7)(uint3)(PVar12 >> 8),1);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"Target \"",8);
                psVar15 = cmTarget::GetName_abi_cxx11_(this->Target);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1a8,(psVar15->_M_dataplus)._M_p,
                                     psVar15->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,"\" links to itself.",0x12);
                pcVar17 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
                std::__cxx11::stringbuf::str();
                GetBacktrace((cmGeneratorTarget *)local_1b8);
                cmake::IssueMessage(pcVar17,local_36c,&local_3b0.Value,
                                    (cmListFileBacktrace *)local_1b8);
                if ((cmMakefile *)local_1b8._8_8_ != (cmMakefile *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b0.Value._M_dataplus._M_p != &local_3b0.Value.field_2) {
                  operator_delete(local_3b0.Value._M_dataplus._M_p,
                                  CONCAT17(local_3b0.Value.field_2._M_local_buf[7],
                                           local_3b0.Value.field_2._M_allocated_capacity._0_7_) + 1)
                  ;
                }
                if ((char)local_370 != '\0') {
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  std::ios_base::~ios_base((ios_base *)&local_138);
                  iVar13 = 1;
                  goto LAB_003f6593;
                }
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base((ios_base *)&local_138);
            }
          }
          else {
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_368._M_string_length ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
            goto LAB_003f61b5;
LAB_003f6159:
            local_348 = &local_338;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_348,_Var7._M_p,_Var7._M_p + (long)(_Alloc_hider *)sVar8);
            local_3b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = ((local_3c0._M_current)->Backtrace).
                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            local_3b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi =
                 ((local_3c0._M_current)->Backtrace).
                 super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
            if (local_3b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_3b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (local_3b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                      .TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_3b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (local_3b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                      .TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_3b0.Value._M_dataplus._M_p = (pointer)&local_3b0.Value.field_2;
            if (local_348 == &local_338) {
              local_3b0.Value.field_2._M_allocated_capacity._0_7_ =
                   (undefined7)
                   CONCAT71(local_338._M_allocated_capacity._1_7_,local_338._M_local_buf[0]);
              local_3b0.Value.field_2._8_7_ = (undefined7)local_338._8_8_;
              local_3b0.Value.field_2._M_local_buf[0xf] = (char)((ulong)local_338._8_8_ >> 0x38);
            }
            else {
              local_3b0.Value._M_dataplus._M_p = (pointer)local_348;
              local_3b0.Value.field_2._M_allocated_capacity._0_7_ =
                   (undefined7)
                   CONCAT71(local_338._M_allocated_capacity._1_7_,local_338._M_local_buf[0]);
            }
            local_3b0.Value.field_2._M_local_buf[7] = (char)((uint7)local_338._1_7_ >> 0x30);
            local_3b0.Value._M_string_length = local_340;
            local_340 = 0;
            local_338._M_local_buf[0] = '\0';
            local_348 = &local_338;
            ResolveLinkItem((cmLinkItem *)local_1a8,this,&local_3b0,local_2f0);
            if (local_3b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_3b0.Backtrace.
                         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b0.Value._M_dataplus._M_p != &local_3b0.Value.field_2) {
              operator_delete(local_3b0.Value._M_dataplus._M_p,
                              CONCAT17(local_3b0.Value.field_2._M_local_buf[7],
                                       local_3b0.Value.field_2._M_allocated_capacity._0_7_) + 1);
            }
            if (local_348 != &local_338) {
              operator_delete(local_348,
                              CONCAT71(local_338._M_allocated_capacity._1_7_,
                                       local_338._M_local_buf[0]) + 1);
            }
            if ((cmGeneratorTarget *)local_188._0_8_ == (cmGeneratorTarget *)0x0) {
              psVar15 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)local_1a8);
              bVar11 = cmsys::SystemTools::FileIsFullPath(psVar15);
              if ((!bVar11) ||
                 (this_02 = cmMakefile::GetSource(local_270,psVar15,Known),
                 this_02 == (cmSourceFile *)0x0)) goto LAB_003f6420;
              paVar1 = &local_3b0.Value.field_2;
              local_3b0.Value.field_2._8_7_ = 0x5443454a424f5f;
              local_3b0.Value.field_2._M_allocated_capacity._0_7_ = 0x414e5245545845;
              local_3b0.Value.field_2._M_local_buf[7] = 'L';
              local_3b0.Value._M_string_length = 0xf;
              local_3b0.Value.field_2._M_local_buf[0xf] = '\0';
              local_3b0.Value._M_dataplus._M_p = (pointer)paVar1;
              bVar11 = cmSourceFile::GetPropertyAsBool(this_02,&local_3b0.Value);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b0.Value._M_dataplus._M_p != paVar1) {
                operator_delete(local_3b0.Value._M_dataplus._M_p,
                                CONCAT17(local_3b0.Value.field_2._M_local_buf[7],
                                         local_3b0.Value.field_2._M_allocated_capacity._0_7_) + 1);
              }
              if (!bVar11) goto LAB_003f6420;
              iVar13 = 6;
              std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                        (local_278,(cmLinkItem *)local_1a8);
            }
            else {
LAB_003f6420:
              iVar13 = 0;
              std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>::
              emplace_back<cmLinkItem,bool_const&>
                        ((vector<cmLinkImplItem,std::allocator<cmLinkImplItem>> *)local_3b8,
                         (cmLinkItem *)local_1a8,&local_3d1);
            }
            if (local_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._0_8_ != &local_198) {
              operator_delete((void *)local_1a8._0_8_,
                              CONCAT44(local_198._M_allocated_capacity._4_4_,
                                       local_198._M_allocated_capacity._0_4_) + 1);
            }
          }
LAB_003f6593:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
          }
          if ((iVar13 != 6) && (iVar13 != 0)) {
            bVar11 = false;
            goto LAB_003f6635;
          }
        }
      }
      psVar6 = &((cmCompiledGeneratorExpression *)
                local_380.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->SeenTargetProperties;
      for (p_Var19 = (((cmCompiledGeneratorExpression *)
                      local_380.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                      .TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left;
          (_Rb_tree_header *)p_Var19 != &(psVar6->_M_t)._M_impl.super__Rb_tree_header;
          p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19)) {
        cVar18 = GetProperty(this,(string *)(p_Var19 + 1));
        if (cVar18.Value == (string *)0x0) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    (local_250,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var19 + 1));
        }
      }
      bVar11 = true;
      cmCompiledGeneratorExpression::GetMaxLanguageStandard
                ((cmCompiledGeneratorExpression *)
                 local_380.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,this,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_268);
LAB_003f6635:
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)&local_380);
      cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_248);
      if (local_1c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c8._M_pi);
      }
      std::
      _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)(local_218 + 0x10));
      if ((pointer)local_228._0_8_ != (pointer)local_218) {
        operator_delete((void *)local_228._0_8_,local_218._0_8_ + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2b8);
      if (!bVar11) {
        return;
      }
      cVar30.End._M_current = local_258._M_current;
      cVar30.Begin._M_current = local_3c0._M_current + 1;
      config = (string *)local_3d0;
    } while (local_3c0._M_current + 1 != local_258._M_current);
  }
  local_258 = cVar30.End._M_current;
  if ((cmGeneratorTarget *)local_2f8._M_p != this) goto LAB_003f6a72;
  local_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_188 + 8);
  local_198._M_allocated_capacity._0_4_ =
       local_380.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi._4_4_;
  local_198._8_8_ = local_3b8;
  local_188._8_4_ = 0;
  local_178 = (element_type *)0x0;
  local_160 = (_Base_ptr)0x0;
  local_158._24_8_ = local_158 + 8;
  local_158._8_4_ = _S_red;
  local_158._16_8_ = (_Base_ptr)0x0;
  local_130._0_8_ = 0;
  local_130._8_8_ = ap_Stack_f8;
  local_120 = (_Base_ptr)0x1;
  local_118._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_110 = (_Base_ptr)0x0;
  local_108 = 1.0;
  local_100 = (_Base_ptr)0x0;
  ap_Stack_f8[0] = (__node_base_ptr)0x0;
  pcVar27 = (cmGeneratorTarget *)
            (((_Vector_impl *)&(local_3b8->Value)._M_dataplus)->super__Vector_impl_data)._M_start;
  pcVar2 = (cmGeneratorTarget *)(local_3b8->Value)._M_string_length;
  local_228._0_8_ = (local_3b8->Value).field_2._M_allocated_capacity;
  (local_3b8->Value).field_2._M_allocated_capacity = 0;
  (((_Vector_impl *)&(local_3b8->Value)._M_dataplus)->super__Vector_impl_data)._M_start =
       (pointer)0x0;
  (local_3b8->Value)._M_string_length = 0;
  local_3d0 = (cmGlobalGenerator *)config;
  local_238._0_8_ = pcVar27;
  local_238._8_8_ = pcVar2;
  local_1a8._0_8_ = this;
  local_1a8._8_8_ = config;
  local_168 = (_Base_ptr)local_170._M_pi;
  local_138 = (_Base_ptr)local_158._24_8_;
  if (pcVar27 != pcVar2) {
    do {
      local_258 = cVar30.End._M_current;
      local_3c0 = cVar30.Begin._M_current;
      std::
      _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
      ::_M_emplace_unique<cmLinkImplItem_const&>
                ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                  *)local_188,(cmLinkImplItem *)pcVar27);
      uVar10 = local_238._8_8_;
      cVar30.End._M_current = local_258._M_current;
      cVar30.Begin._M_current = local_3c0._M_current;
      pcVar27 = (cmGeneratorTarget *)&(pcVar27->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header;
    } while (pcVar27 != pcVar2);
    if (local_238._0_8_ != local_238._8_8_) {
      pcVar27 = (cmGeneratorTarget *)local_238._0_8_;
      do {
        anon_unknown.dwarf_16fe349::TransitiveLinkImpl::Follow
                  ((TransitiveLinkImpl *)local_1a8,
                   (cmGeneratorTarget *)
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&pcVar27->ObjectDirectory)->_M_allocated_capacity);
        std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::emplace_back<cmLinkImplItem>
                  ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)local_198._8_8_,
                   (cmLinkImplItem *)pcVar27);
        pcVar27 = (cmGeneratorTarget *)&(pcVar27->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header
        ;
      } while (pcVar27 != (cmGeneratorTarget *)uVar10);
    }
  }
  pcVar24 = *(cmLinkImplItem **)local_198._8_8_;
  local_3c0._M_current =
       (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
       local_198._8_8_;
  local_3c8 = *(cmLinkImplItem **)(local_198._8_8_ + 8);
  lVar23 = (long)local_3c8 - (long)pcVar24;
  lVar28 = (lVar23 >> 3) * -0x71c71c71c71c71c7 >> 2;
  if (0 < lVar28) {
    lVar28 = lVar28 + 1;
    do {
      iVar20 = std::
               _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
               ::find((_Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                       *)local_158,&pcVar24->super_cmLinkItem);
      config = (string *)local_3d0;
      this_03 = pcVar24;
      pcVar29 = local_3c8;
      if (iVar20._M_node != (_Base_ptr)(local_158 + 8)) goto LAB_003f6988;
      iVar20 = std::
               _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
               ::find((_Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                       *)local_158,&pcVar24[1].super_cmLinkItem);
      config = (string *)local_3d0;
      this_03 = pcVar24 + 1;
      pcVar29 = local_3c8;
      if (iVar20._M_node != (_Base_ptr)(local_158 + 8)) goto LAB_003f6988;
      iVar20 = std::
               _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
               ::find((_Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                       *)local_158,&pcVar24[2].super_cmLinkItem);
      config = (string *)local_3d0;
      this_03 = pcVar24 + 2;
      pcVar29 = local_3c8;
      if (iVar20._M_node != (_Base_ptr)(local_158 + 8)) goto LAB_003f6988;
      iVar20 = std::
               _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
               ::find((_Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                       *)local_158,&pcVar24[3].super_cmLinkItem);
      config = (string *)local_3d0;
      this_03 = pcVar24 + 3;
      pcVar29 = local_3c8;
      if (iVar20._M_node != (_Base_ptr)(local_158 + 8)) goto LAB_003f6988;
      pcVar24 = pcVar24 + 4;
      lVar28 = lVar28 + -1;
      lVar23 = lVar23 + -0x120;
    } while (1 < lVar28);
  }
  pcVar29 = local_3c8;
  lVar23 = (lVar23 >> 3) * -0x71c71c71c71c71c7;
  config = (string *)local_3d0;
  if (lVar23 == 1) {
LAB_003f6966:
    iVar20 = std::
             _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
             ::find((_Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                     *)local_158,&pcVar24->super_cmLinkItem);
    this_03 = pcVar24;
    if (iVar20._M_node == (_Base_ptr)(local_158 + 8)) {
      this_03 = pcVar29;
    }
LAB_003f6988:
    __first._M_current = pcVar29;
    if ((this_03 != pcVar29) &&
       (pcVar24 = this_03 + 1, __first._M_current = this_03, pcVar24 != pcVar29)) {
      do {
        iVar20 = std::
                 _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                 ::find((_Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                         *)local_158,&pcVar24->super_cmLinkItem);
        if (iVar20._M_node == (_Base_ptr)(local_158 + 8)) {
          std::__cxx11::string::operator=((string *)this_03,(string *)pcVar24);
          (this_03->super_cmLinkItem).Target = (pcVar24->super_cmLinkItem).Target;
          (this_03->super_cmLinkItem).Cross = (pcVar24->super_cmLinkItem).Cross;
          peVar4 = (pcVar24->super_cmLinkItem).Backtrace.
                   super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          p_Var5 = (pcVar24->super_cmLinkItem).Backtrace.
                   super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (pcVar24->super_cmLinkItem).Backtrace.
          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (pcVar24->super_cmLinkItem).Backtrace.
          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_00 = (this_03->super_cmLinkItem).Backtrace.
                    super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (this_03->super_cmLinkItem).Backtrace.
          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar4;
          (this_03->super_cmLinkItem).Backtrace.
          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var5;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          this_03->CheckCMP0027 = pcVar24->CheckCMP0027;
          this_03 = this_03 + 1;
        }
        pcVar24 = pcVar24 + 1;
        __first._M_current = this_03;
      } while (pcVar24 != pcVar29);
    }
  }
  else {
    if (lVar23 == 2) {
LAB_003f6939:
      config = (string *)local_3d0;
      iVar20 = std::
               _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
               ::find((_Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                       *)local_158,&pcVar24->super_cmLinkItem);
      this_03 = pcVar24;
      if (iVar20._M_node == (_Base_ptr)(local_158 + 8)) {
        pcVar24 = pcVar24 + 1;
        goto LAB_003f6966;
      }
      goto LAB_003f6988;
    }
    __first._M_current = local_3c8;
    if (lVar23 == 3) {
      iVar20 = std::
               _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
               ::find((_Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                       *)local_158,&pcVar24->super_cmLinkItem);
      config = (string *)local_3d0;
      this_03 = pcVar24;
      if (iVar20._M_node == (_Base_ptr)(local_158 + 8)) {
        pcVar24 = pcVar24 + 1;
        goto LAB_003f6939;
      }
      goto LAB_003f6988;
    }
  }
  std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::_M_erase
            ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)local_3c0._M_current,__first
             ,*(cmLinkImplItem **)(local_198._8_8_ + 8));
  std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::~vector
            ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)local_238);
  std::
  _Hashtable<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>,_std::__detail::_Identity,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>,_std::__detail::_Identity,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)(local_130 + 8));
  std::
  _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
  ::~_Rb_tree((_Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
               *)local_158);
  std::
  _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
  ::~_Rb_tree((_Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
               *)local_188);
  cVar30.End._M_current = local_258._M_current;
  cVar30.Begin._M_current = local_3c0._M_current;
LAB_003f6a72:
  local_258 = cVar30.End._M_current;
  local_3c0 = cVar30.Begin._M_current;
  pcVar17 = cmMakefile::GetCMakeInstance(this->Makefile);
  cmake::GetDebugConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_368,pcVar17);
  if ((((cmGlobalGenerator *)config)->TryCompileTimeout).__r == 0.0) {
    uVar25 = 2;
  }
  else {
    cmsys::SystemTools::UpperCase((string *)local_1a8,config);
    _Var21 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (local_368._M_dataplus._M_p,local_368._M_string_length,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != &local_198) {
      operator_delete((void *)local_1a8._0_8_,
                      CONCAT44(local_198._M_allocated_capacity._4_4_,
                               local_198._M_allocated_capacity._0_4_) + 1);
    }
    uVar25 = (_Var21._M_current ==
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_368._M_string_length) + 1;
  }
  pLVar22 = cmTarget::GetOriginalLinkLibraries_abi_cxx11_(this->Target);
  item_00 = (pLVar22->
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (pLVar22->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (item_00 != ppVar3) {
    local_3b8 = local_3b8 + 1;
    do {
      if ((item_00->second & ~uVar25) != GENERAL_LibraryType) {
        CheckCMP0004(&local_3b0.Value,this,&item_00->first);
        psVar15 = cmTarget::GetName_abi_cxx11_(this->Target);
        sVar8 = local_3b0.Value._M_string_length;
        _Var7._M_p = local_3b0.Value._M_dataplus._M_p;
        if (local_3b0.Value._M_string_length == psVar15->_M_string_length) {
          if ((local_3b0.Value._M_string_length != 0) &&
             (iVar13 = bcmp(local_3b0.Value._M_dataplus._M_p,(psVar15->_M_dataplus)._M_p,
                            local_3b0.Value._M_string_length), iVar13 != 0)) {
LAB_003f6b94:
            local_328 = (cmGeneratorTarget *)local_318;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_328,_Var7._M_p,_Var7._M_p + sVar8);
            local_318._16_8_ = (cmLocalGenerator *)0x0;
            pcStack_300 = (cmGlobalGenerator *)0x0;
            cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                      ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)(local_318 + 0x10));
            local_238._0_8_ = local_228;
            if (local_328 == (cmGeneratorTarget *)local_318) {
              local_228._8_8_ = local_318._8_8_;
            }
            else {
              local_238._0_8_ = local_328;
            }
            local_228._1_7_ = local_318._1_7_;
            local_228[0] = local_318[0];
            local_238._8_8_ = local_320;
            local_320 = (cmGeneratorTarget *)0x0;
            local_318[0] = 0;
            local_218._0_8_ = local_318._16_8_;
            local_218._8_8_ = pcStack_300;
            local_318._16_8_ = (cmLocalGenerator *)0x0;
            pcStack_300 = (cmGlobalGenerator *)0x0;
            local_328 = (cmGeneratorTarget *)local_318;
            ResolveLinkItem((cmLinkItem *)local_1a8,this,
                            (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_238,this->LocalGenerator);
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                      ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_3b8,
                       (cmLinkItem *)local_1a8);
            if (local_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._0_8_ != &local_198) {
              operator_delete((void *)local_1a8._0_8_,
                              CONCAT44(local_198._M_allocated_capacity._4_4_,
                                       local_198._M_allocated_capacity._0_4_) + 1);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
            }
            if ((cmGeneratorTarget *)local_238._0_8_ != (cmGeneratorTarget *)local_228) {
              operator_delete((void *)local_238._0_8_,(ulong)(local_228._0_8_ + 1));
            }
            if (pcStack_300 != (cmGlobalGenerator *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcStack_300);
            }
            if (local_328 != (cmGeneratorTarget *)local_318) {
              operator_delete(local_328,CONCAT71(local_318._1_7_,local_318[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b0.Value._M_dataplus._M_p != &local_3b0.Value.field_2) {
              operator_delete(local_3b0.Value._M_dataplus._M_p,
                              CONCAT17(local_3b0.Value.field_2._M_local_buf[7],
                                       local_3b0.Value.field_2._M_allocated_capacity._0_7_) + 1);
            }
            goto LAB_003f6d4b;
          }
        }
        else if (local_3b0.Value._M_string_length != 0) goto LAB_003f6b94;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var7._M_p != &local_3b0.Value.field_2) {
          operator_delete(_Var7._M_p,
                          CONCAT17(local_3b0.Value.field_2._M_local_buf[7],
                                   local_3b0.Value.field_2._M_allocated_capacity._0_7_) + 1);
        }
      }
LAB_003f6d4b:
      item_00 = item_00 + 1;
    } while (item_00 != ppVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_368);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkImplementationLibraries(
  const std::string& config, cmOptionalLinkImplementation& impl,
  cmGeneratorTarget const* head, LinkInterfaceFor implFor) const
{
  cmLocalGenerator const* lg = this->LocalGenerator;
  cmMakefile const* mf = lg->GetMakefile();
  cmBTStringRange entryRange = this->Target->GetLinkImplementationEntries();
  // Collect libraries directly linked in this configuration.
  for (auto const& entry : entryRange) {
    std::vector<std::string> llibs;
    // Keep this logic in sync with ExpandLinkItems.
    cmGeneratorExpressionDAGChecker dagChecker(this, "LINK_LIBRARIES", nullptr,
                                               nullptr);
    // The $<LINK_ONLY> expression may be used to specify link dependencies
    // that are otherwise excluded from usage requirements.
    if (implFor == LinkInterfaceFor::Usage) {
      switch (this->GetPolicyStatusCMP0131()) {
        case cmPolicies::WARN:
        case cmPolicies::OLD:
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          dagChecker.SetTransitivePropertiesOnly();
          break;
      }
    }
    cmGeneratorExpression ge(entry.Backtrace);
    std::unique_ptr<cmCompiledGeneratorExpression> const cge =
      ge.Parse(entry.Value);
    cge->SetEvaluateForBuildsystem(true);
    std::string const& evaluated =
      cge->Evaluate(this->LocalGenerator, config, head, &dagChecker, nullptr,
                    this->LinkerLanguage);
    bool const checkCMP0027 = evaluated != entry.Value;
    cmExpandList(evaluated, llibs);
    if (cge->GetHadHeadSensitiveCondition()) {
      impl.HadHeadSensitiveCondition = true;
    }
    if (cge->GetHadContextSensitiveCondition()) {
      impl.HadContextSensitiveCondition = true;
    }
    if (cge->GetHadLinkLanguageSensitiveCondition()) {
      impl.HadLinkLanguageSensitiveCondition = true;
    }

    for (std::string const& lib : llibs) {
      if (this->IsLinkLookupScope(lib, lg)) {
        continue;
      }

      // Skip entries that resolve to the target itself or are empty.
      std::string name = this->CheckCMP0004(lib);
      if (this->GetPolicyStatusCMP0108() == cmPolicies::NEW) {
        // resolve alias name
        auto* target = this->Makefile->FindTargetToUse(name);
        if (target) {
          name = target->GetName();
        }
      }
      if (name == this->GetName() || name.empty()) {
        if (name == this->GetName()) {
          bool noMessage = false;
          MessageType messageType = MessageType::FATAL_ERROR;
          std::ostringstream e;
          switch (this->GetPolicyStatusCMP0038()) {
            case cmPolicies::WARN: {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0038) << "\n";
              messageType = MessageType::AUTHOR_WARNING;
            } break;
            case cmPolicies::OLD:
              noMessage = true;
              break;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
          }

          if (!noMessage) {
            e << "Target \"" << this->GetName() << "\" links to itself.";
            this->LocalGenerator->GetCMakeInstance()->IssueMessage(
              messageType, e.str(), this->GetBacktrace());
            if (messageType == MessageType::FATAL_ERROR) {
              return;
            }
          }
        }
        continue;
      }

      // The entry is meant for this configuration.
      cmLinkItem item =
        this->ResolveLinkItem(BT<std::string>(name, entry.Backtrace), lg);
      if (!item.Target) {
        // Report explicitly linked object files separately.
        std::string const& maybeObj = item.AsStr();
        if (cmSystemTools::FileIsFullPath(maybeObj)) {
          cmSourceFile const* sf =
            mf->GetSource(maybeObj, cmSourceFileLocationKind::Known);
          if (sf && sf->GetPropertyAsBool("EXTERNAL_OBJECT")) {
            impl.Objects.emplace_back(std::move(item));
            continue;
          }
        }
      }

      impl.Libraries.emplace_back(std::move(item), checkCMP0027);
    }

    std::set<std::string> const& seenProps = cge->GetSeenTargetProperties();
    for (std::string const& sp : seenProps) {
      if (!this->GetProperty(sp)) {
        this->LinkImplicitNullProperties.insert(sp);
      }
    }
    cge->GetMaxLanguageStandard(this, this->MaxLanguageStandards);
  }

  // Update the list of direct link dependencies from usage requirements.
  if (head == this) {
    ComputeLinkImplTransitive(this, config, implFor, impl);
  }

  // Get the list of configurations considered to be DEBUG.
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();

  cmTargetLinkLibraryType linkType =
    CMP0003_ComputeLinkType(config, debugConfigs);
  cmTarget::LinkLibraryVectorType const& oldllibs =
    this->Target->GetOriginalLinkLibraries();
  for (cmTarget::LibraryID const& oldllib : oldllibs) {
    if (oldllib.second != GENERAL_LibraryType && oldllib.second != linkType) {
      std::string name = this->CheckCMP0004(oldllib.first);
      if (name == this->GetName() || name.empty()) {
        continue;
      }
      // Support OLD behavior for CMP0003.
      impl.WrongConfigLibraries.push_back(
        this->ResolveLinkItem(BT<std::string>(name)));
    }
  }
}